

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O2

LY_ERR nacm_inherit_clb(lysc_node *node,void *data,ly_bool *dfs_continue)

{
  void **ppvVar1;
  void *pvVar2;
  lysc_ext_instance *plVar3;
  lysc_ext **pplVar4;
  ly_stmt lVar5;
  LY_ERR LVar6;
  lysc_ext_instance *plVar7;
  long *plVar8;
  long lVar9;
  uint16_t nodetype;
  
  LVar6 = LY_SUCCESS;
  if ((*(lysc_node **)((long)data + 8) != node) &&
     (nodetype = node->nodetype, (nodetype & 0x3000) == 0)) {
    plVar7 = node->exts;
    if (plVar7 == (lysc_ext_instance *)0x0) {
      plVar8 = (long *)malloc(0x50);
      if (plVar8 == (long *)0x0) {
LAB_001950fc:
        LVar6 = LY_EMEM;
        lyplg_ext_compile_log
                  ((lysc_ctx *)0x0,*data,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "nacm_inherit_clb");
      }
      else {
        *plVar8 = 1;
        lVar9 = 1;
LAB_00195065:
        node->exts = (lysc_ext_instance *)(plVar8 + 1);
        plVar8 = plVar8 + lVar9 * 9;
        plVar8[-2] = 0;
        plVar8[-1] = 0;
        plVar8[-4] = 0;
        plVar8[-3] = 0;
        plVar8[-6] = 0;
        plVar8[-5] = 0;
        plVar8[-8] = 0;
        plVar8[-7] = 0;
        *plVar8 = 0;
        plVar8[-8] = **data;
        plVar8[-4] = (long)node;
        lVar5 = lyplg_ext_nodetype2stmt(nodetype);
        *(ly_stmt *)(plVar8 + -3) = lVar5;
        lVar9 = *data;
        if (*(char **)(lVar9 + 8) != (char *)0x0) {
          LVar6 = lydict_insert(node->module->ctx,*(char **)(lVar9 + 8),0,(char **)(plVar8 + -7));
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          lVar9 = *data;
        }
        *plVar8 = *(long *)(lVar9 + 0x40);
        LVar6 = LY_SUCCESS;
      }
    }
    else {
      plVar3 = plVar7 + -1;
      pvVar2 = plVar7[-1].compiled;
      lVar9 = (long)pvVar2 + 1;
      do {
        lVar9 = lVar9 + -1;
        if (lVar9 == 0) {
          plVar3->compiled = (void *)((long)pvVar2 + 1);
          plVar8 = (long *)realloc(&plVar3->compiled,(long)pvVar2 * 0x48 + 0x50);
          if (plVar8 == (long *)0x0) {
            ppvVar1 = &node->exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            goto LAB_001950fc;
          }
          lVar9 = *plVar8;
          nodetype = node->nodetype;
          goto LAB_00195065;
        }
        pplVar4 = &plVar7->def;
        plVar7 = plVar7 + 1;
      } while (*pplVar4 != (lysc_ext *)**data);
      *dfs_continue = '\x01';
      LVar6 = LY_SUCCESS;
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
nacm_inherit_clb(struct lysc_node *node, void *data, ly_bool *dfs_continue)
{
    LY_ERR ret;
    struct nacm_dfs_arg *arg = data;
    struct lysc_ext_instance *inherited;
    LY_ARRAY_COUNT_TYPE u;

    /* ignore the parent from which we inherit and input/output nodes */
    if ((node != arg->parent) && !(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        /* check that the node does not have its own NACM extension instance */
        LY_ARRAY_FOR(node->exts, u) {
            if (node->exts[u].def == arg->ext->def) {
                /* the child already have its own NACM flag, so skip the subtree */
                *dfs_continue = 1;
                return LY_SUCCESS;
            }
        }

        /* duplicate this one to inherit it to the child */
        LY_ARRAY_NEW_GOTO(node->module->ctx, node->exts, inherited, ret, emem);

        inherited->def = arg->ext->def;
        inherited->parent = node;
        inherited->parent_stmt = lyplg_ext_nodetype2stmt(node->nodetype);
        if (arg->ext->argument) {
            if ((ret = lydict_insert(node->module->ctx, arg->ext->argument, 0, &inherited->argument))) {
                return ret;
            }
        }
        /* copy the pointer to the static variables */
        inherited->compiled = arg->ext->compiled;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(NULL, arg->ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return ret;
}